

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::Bitstream::convertToBitVector
          (ConstantValue *__return_storage_ptr__,Bitstream *this,ConstantValue *value,
          SourceRange sourceRange,EvalContext *context)

{
  uint64_t uVar1;
  Type *this_00;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffd0;
  
  if ((byte)this[0x20] < 2) {
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)this);
  }
  else {
    uVar1 = ConstantValue::getBitstreamWidth((ConstantValue *)this);
    this_00 = Compilation::getType
                        ((Compilation *)**(undefined8 **)sourceRange.endLoc,(bitwidth_t)uVar1,
                         (bitmask<slang::ast::IntegralFlags>)0x2);
    evaluateCast(__return_storage_ptr__,(Bitstream *)this_00,(Type *)this,value,sourceRange,
                 (EvalContext *)CONCAT44(in_stack_ffffffffffffffcc,1),
                 (bool)in_stack_ffffffffffffffd0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue Bitstream::convertToBitVector(ConstantValue&& value, SourceRange sourceRange,
                                            EvalContext& context) {
    if (value.bad() || value.isInteger())
        return value;

    // We don't worry about width being too large for an integral type here because we limit
    // how large any constant value can be.
    const uint64_t width = value.getBitstreamWidth();
    auto& type = context.getCompilation().getType(bitwidth_t(width), IntegralFlags::FourState |
                                                                         IntegralFlags::Unsigned);

    return evaluateCast(type, std::move(value), sourceRange, context, /* isImplicit */ true);
}